

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O3

int anon_unknown.dwarf_1b26e::RtMidiOut_dtor(lua_State *L)

{
  RtMidi *midi;
  
  midi = (RtMidi *)lua_touserdata(L,1);
  if (midi != (RtMidi *)0x0) {
    RtMidi_gc(midi,L);
    (*midi->_vptr_RtMidi[7])(midi);
  }
  return 0;
}

Assistant:

int RtMidiOut_dtor(lua_State *L) {
	auto midiout = reinterpret_cast<RtMidiOut *>(
	 lua_touserdata(L, 1));
	if (midiout) {
		RtMidi_gc(*midiout, L);
		midiout->~RtMidiOut();
	}
	return 0;
}